

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall string_find_Test::TestBody(string_find_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1080;
  Message local_1078;
  string local_1070;
  ST_ssize_t local_1050;
  int local_1044;
  undefined1 local_1040 [8];
  AssertionResult gtest_ar_49;
  Message local_1028;
  string local_1020;
  ST_ssize_t local_1000;
  int local_ff4;
  undefined1 local_ff0 [8];
  AssertionResult gtest_ar_48;
  Message local_fd8;
  string local_fd0;
  ST_ssize_t local_fb0;
  int local_fa4;
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar_47;
  Message local_f88;
  string local_f80;
  ST_ssize_t local_f60;
  int local_f54;
  undefined1 local_f50 [8];
  AssertionResult gtest_ar_46;
  Message local_f38;
  string local_f30;
  ST_ssize_t local_f10;
  int local_f04;
  undefined1 local_f00 [8];
  AssertionResult gtest_ar_45;
  Message local_ee8;
  string local_ee0;
  ST_ssize_t local_ec0;
  int local_eb4;
  undefined1 local_eb0 [8];
  AssertionResult gtest_ar_44;
  Message local_e98;
  string local_e90;
  ST_ssize_t local_e70;
  int local_e64;
  undefined1 local_e60 [8];
  AssertionResult gtest_ar_43;
  Message local_e48;
  string local_e40;
  ST_ssize_t local_e20;
  int local_e14;
  undefined1 local_e10 [8];
  AssertionResult gtest_ar_42;
  Message local_df8;
  string local_df0;
  ST_ssize_t local_dd0;
  int local_dc4;
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar_41;
  Message local_da8;
  string local_da0;
  ST_ssize_t local_d80;
  int local_d74;
  undefined1 local_d70 [8];
  AssertionResult gtest_ar_40;
  Message local_d58;
  string local_d50;
  ST_ssize_t local_d30;
  int local_d24;
  undefined1 local_d20 [8];
  AssertionResult gtest_ar_39;
  Message local_d08;
  string local_d00;
  ST_ssize_t local_ce0;
  int local_cd4;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar_38;
  Message local_cb8;
  string local_cb0;
  ST_ssize_t local_c90;
  int local_c84;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar_37;
  Message local_c68;
  string local_c60;
  ST_ssize_t local_c40;
  int local_c34;
  undefined1 local_c30 [8];
  AssertionResult gtest_ar_36;
  Message local_c18;
  string local_c10;
  ST_ssize_t local_bf0;
  int local_be4;
  undefined1 local_be0 [8];
  AssertionResult gtest_ar_35;
  Message local_bc8;
  string local_bc0;
  ST_ssize_t local_ba0;
  int local_b94;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_34;
  Message local_b78;
  ST_ssize_t local_b70;
  int local_b64;
  undefined1 local_b60 [8];
  AssertionResult gtest_ar_33;
  Message local_b48;
  ST_ssize_t local_b40;
  int local_b34;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_32;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  AssertHelper local_a80;
  Message local_a78;
  ST_ssize_t local_a70;
  int local_a64;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_31;
  Message local_a48;
  ST_ssize_t local_a40;
  int local_a34;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar_30;
  string local_a00;
  string local_9e0;
  AssertHelper local_9c0;
  Message local_9b8;
  ST_ssize_t local_9b0;
  int local_9a4;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_29;
  Message local_988;
  ST_ssize_t local_980;
  int local_974;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_28;
  string local_940;
  string local_920;
  undefined1 local_900 [8];
  string haystack;
  Message local_8d8;
  string local_8d0;
  ST_ssize_t local_8b0;
  int local_8a4;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_27;
  Message local_888;
  string local_880;
  ST_ssize_t local_860;
  int local_854;
  undefined1 local_850 [8];
  AssertionResult gtest_ar_26;
  Message local_838;
  string local_830;
  ST_ssize_t local_810;
  int local_804;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_25;
  Message local_7e8;
  string local_7e0;
  ST_ssize_t local_7c0;
  int local_7b4;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_24;
  Message local_798;
  string local_790;
  ST_ssize_t local_770;
  int local_764;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_23;
  Message local_748;
  string local_740;
  ST_ssize_t local_720;
  int local_714;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_22;
  Message local_6f8;
  string local_6f0;
  ST_ssize_t local_6d0;
  int local_6c4;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_21;
  Message local_6a8;
  string local_6a0;
  ST_ssize_t local_680;
  int local_674;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_20;
  Message local_658;
  string local_650;
  ST_ssize_t local_630;
  int local_624;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_19;
  Message local_608;
  string local_600;
  ST_ssize_t local_5e0;
  int local_5d4;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_18;
  Message local_5b8;
  string local_5b0;
  ST_ssize_t local_590;
  int local_584;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_17;
  Message local_568;
  string local_560;
  ST_ssize_t local_540;
  int local_534;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_16;
  Message local_518;
  string local_510;
  ST_ssize_t local_4f0;
  int local_4e4;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_15;
  Message local_4c8;
  string local_4c0;
  ST_ssize_t local_4a0;
  int local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_14;
  Message local_478;
  string local_470;
  ST_ssize_t local_450;
  int local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_13;
  Message local_428;
  string local_420;
  ST_ssize_t local_400;
  int local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_12;
  Message local_3d8;
  string local_3d0;
  ST_ssize_t local_3b0;
  int local_3a4;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_11;
  Message local_388;
  string local_380;
  ST_ssize_t local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_10;
  Message local_338;
  string local_330;
  ST_ssize_t local_310;
  int local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_9;
  Message local_2e8;
  string local_2e0;
  ST_ssize_t local_2c0;
  int local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_8;
  Message local_298;
  string local_290;
  ST_ssize_t local_270;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_7;
  Message local_248;
  string local_240;
  ST_ssize_t local_220;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8;
  string local_1f0;
  ST_ssize_t local_1d0;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  Message local_1a8;
  string local_1a0;
  ST_ssize_t local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_4;
  Message local_158;
  string local_150;
  ST_ssize_t local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_3;
  Message local_108;
  string local_100;
  ST_ssize_t local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  string local_b0;
  ST_ssize_t local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  string local_50;
  ST_ssize_t local_30;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  string_find_Test *this_local;
  
  local_24 = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ST::string::from_validated(&local_50,"ABCDabcd",8);
  local_30 = ST::string::find(&local_50,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_20,"0",
             "ST::string::from_validated(\"\" \"ABCDabcd\" \"\", sizeof(\"ABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,&local_24,&local_30);
  ST::string::~string(&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x673,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_84 = 4;
  ST::string::from_validated(&local_b0,"abcdABCDABCDabcd",0x10);
  local_90 = ST::string::find(&local_b0,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_80,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,&local_84,&local_90);
  ST::string::~string(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x674,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_d4 = 4;
  ST::string::from_validated(&local_100,"abcdABCDabcd",0xc);
  local_e0 = ST::string::find(&local_100,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_d0,"4",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,&local_d4,&local_e0);
  ST::string::~string(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x675,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_124 = 4;
  ST::string::from_validated(&local_150,"abcdABCD",8);
  local_130 = ST::string::find(&local_150,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_120,"4",
             "ST::string::from_validated(\"\" \"abcdABCD\" \"\", sizeof(\"abcdABCD\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,&local_124,&local_130);
  ST::string::~string(&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x676,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_174 = 0;
  ST::string::from_validated(&local_1a0,"ABCDxxxx",8);
  local_180 = ST::string::find(&local_1a0,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_170,"0",
             "ST::string::from_validated(\"\" \"ABCDxxxx\" \"\", sizeof(\"ABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_174,&local_180);
  ST::string::~string(&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x679,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1c4 = 4;
  ST::string::from_validated(&local_1f0,"xxxxABCDABCDxxxx",0x10);
  local_1d0 = ST::string::find(&local_1f0,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_1c0,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDABCDxxxx\" \"\", sizeof(\"xxxxABCDABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_1c4,&local_1d0);
  ST::string::~string(&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_214 = 4;
  ST::string::from_validated(&local_240,"xxxxABCDxxxx",0xc);
  local_220 = ST::string::find(&local_240,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_210,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDxxxx\" \"\", sizeof(\"xxxxABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_214,&local_220);
  ST::string::~string(&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_264 = 4;
  ST::string::from_validated(&local_290,"xxxxABCD",8);
  local_270 = ST::string::find(&local_290,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_260,"4",
             "ST::string::from_validated(\"\" \"xxxxABCD\" \"\", sizeof(\"xxxxABCD\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_264,&local_270);
  ST::string::~string(&local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2b4 = 0;
  ST::string::from_validated(&local_2e0,"abcdxxxx",8);
  local_2c0 = ST::string::find(&local_2e0,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_2b0,"0",
             "ST::string::from_validated(\"\" \"abcdxxxx\" \"\", sizeof(\"abcdxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_2b4,&local_2c0);
  ST::string::~string(&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_304 = 4;
  ST::string::from_validated(&local_330,"xxxxabcdABCDxxxx",0x10);
  local_310 = ST::string::find(&local_330,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_300,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdABCDxxxx\" \"\", sizeof(\"xxxxabcdABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_304,&local_310);
  ST::string::~string(&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_354 = 4;
  ST::string::from_validated(&local_380,"xxxxabcdxxxx",0xc);
  local_360 = ST::string::find(&local_380,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_350,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_354,&local_360);
  ST::string::~string(&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_3a4 = 4;
  ST::string::from_validated(&local_3d0,"xxxxabcd",8);
  local_3b0 = ST::string::find(&local_3d0,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_3a0,"4",
             "ST::string::from_validated(\"\" \"xxxxabcd\" \"\", sizeof(\"xxxxabcd\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_3a4,&local_3b0);
  ST::string::~string(&local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x680,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_3f4 = 0;
  ST::string::from_validated(&local_420,"ABCDxxxx",8);
  local_400 = ST::string::find(&local_420,"abcd",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_3f0,"0",
             "ST::string::from_validated(\"\" \"ABCDxxxx\" \"\", sizeof(\"ABCDxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,&local_3f4,&local_400);
  ST::string::~string(&local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x681,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_444 = 4;
  ST::string::from_validated(&local_470,"xxxxABCDabcdxxxx",0x10);
  local_450 = ST::string::find(&local_470,"abcd",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_440,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDabcdxxxx\" \"\", sizeof(\"xxxxABCDabcdxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,&local_444,&local_450);
  ST::string::~string(&local_470);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x682,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_494 = 4;
  ST::string::from_validated(&local_4c0,"xxxxABCDxxxx",0xc);
  local_4a0 = ST::string::find(&local_4c0,"abcd",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_490,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDxxxx\" \"\", sizeof(\"xxxxABCDxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,&local_494,&local_4a0);
  ST::string::~string(&local_4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x683,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  local_4e4 = 4;
  ST::string::from_validated(&local_510,"xxxxABCD",8);
  local_4f0 = ST::string::find(&local_510,"abcd",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_4e0,"4",
             "ST::string::from_validated(\"\" \"xxxxABCD\" \"\", sizeof(\"xxxxABCD\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,&local_4e4,&local_4f0);
  ST::string::~string(&local_510);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x684,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  local_534 = -1;
  ST::string::from_validated(&local_560,"xxxx",4);
  local_540 = ST::string::find(&local_560,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_530,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,&local_534,&local_540);
  ST::string::~string(&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x687,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  local_584 = -1;
  ST::string::from_validated(&local_5b0,"xxxx",4);
  local_590 = ST::string::find(&local_5b0,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_580,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_584,&local_590);
  ST::string::~string(&local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x688,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  local_5d4 = -1;
  ST::string::from_validated(&local_600,"xxxxABC",7);
  local_5e0 = ST::string::find(&local_600,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_5d0,"-1",
             "ST::string::from_validated(\"\" \"xxxxABC\" \"\", sizeof(\"xxxxABC\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,&local_5d4,&local_5e0);
  ST::string::~string(&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x689,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_624 = -1;
  ST::string::from_validated(&local_650,"xxxxABC",7);
  local_630 = ST::string::find(&local_650,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_620,"-1",
             "ST::string::from_validated(\"\" \"xxxxABC\" \"\", sizeof(\"xxxxABC\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_624,&local_630);
  ST::string::~string(&local_650);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  local_674 = -1;
  ST::string::from_validated(&local_6a0,"xxxxABCxxxx",0xb);
  local_680 = ST::string::find(&local_6a0,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_670,"-1",
             "ST::string::from_validated(\"\" \"xxxxABCxxxx\" \"\", sizeof(\"xxxxABCxxxx\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,&local_674,&local_680);
  ST::string::~string(&local_6a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_6c4 = -1;
  ST::string::from_validated(&local_6f0,"xxxxABCxxxx",0xb);
  local_6d0 = ST::string::find(&local_6f0,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_6c0,"-1",
             "ST::string::from_validated(\"\" \"xxxxABCxxxx\" \"\", sizeof(\"xxxxABCxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,&local_6c4,&local_6d0);
  ST::string::~string(&local_6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  local_714 = -1;
  ST::string::string(&local_740);
  local_720 = ST::string::find(&local_740,"AAAA",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_710,"-1","ST::string().find(\"AAAA\", ST::case_sensitive)",&local_714
             ,&local_720);
  ST::string::~string(&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar1) {
    testing::Message::Message(&local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  local_764 = -1;
  ST::string::string(&local_790);
  local_770 = ST::string::find(&local_790,"AAAA",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_760,"-1","ST::string().find(\"AAAA\", ST::case_insensitive)",
             &local_764,&local_770);
  ST::string::~string(&local_790);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x690,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  local_7b4 = -1;
  ST::string::from_validated(&local_7e0,"xxxx",4);
  local_7c0 = ST::string::find(&local_7e0,"",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_7b0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_sensitive)"
             ,&local_7b4,&local_7c0);
  ST::string::~string(&local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x691,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  local_804 = -1;
  ST::string::from_validated(&local_830,"xxxx",4);
  local_810 = ST::string::find(&local_830,(char *)0x0,case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_800,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find((const char *)nullptr, ST::case_sensitive)"
             ,&local_804,&local_810);
  ST::string::~string(&local_830);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(&local_838);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x692,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_838);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  local_854 = -1;
  ST::string::string(&local_880);
  local_860 = ST::string::find(&local_880,"",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_850,"-1","ST::string().find(\"\", ST::case_sensitive)",&local_854,
             &local_860);
  ST::string::~string(&local_880);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_850);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_850);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x693,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_850);
  local_8a4 = -1;
  ST::string::string(&local_8d0);
  local_8b0 = ST::string::find(&local_8d0,(char *)0x0,case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_8a0,"-1",
             "ST::string().find((const char *)nullptr, ST::case_sensitive)",&local_8a4,&local_8b0);
  ST::string::~string(&local_8d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(haystack.m_buffer.m_data + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x694,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(haystack.m_buffer.m_data + 8),&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(haystack.m_buffer.m_data + 8));
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  ST::string::string((string *)local_900);
  ST::string::from_validated(&local_940,"xxxx",4);
  ST::string::from_utf32
            ((string *)&gtest_ar_28.message_,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",
             0xffffffffffffffff,check_validity);
  ST::operator+(&local_920,&local_940,(string *)&gtest_ar_28.message_);
  ST::string::operator=((string *)local_900,&local_920);
  ST::string::~string(&local_920);
  ST::string::~string((string *)&gtest_ar_28.message_);
  ST::string::~string(&local_940);
  local_974 = 4;
  local_980 = ST::string::find((string *)local_900,utf8_test_data,case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_970,"4","haystack.find(utf8_test_data, ST::case_sensitive)",
             &local_974,&local_980);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar1) {
    testing::Message::Message(&local_988);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x699,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  local_9a4 = 4;
  local_9b0 = ST::string::find((string *)local_900,utf8_test_data,case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_9a0,"4","haystack.find(utf8_test_data, ST::case_insensitive)",
             &local_9a4,&local_9b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar1) {
    testing::Message::Message(&local_9b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    testing::Message::~Message(&local_9b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  ST::string::from_utf32
            (&local_a00,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff,
             check_validity);
  ST::string::from_validated((string *)&gtest_ar_30.message_,"xxxx",4);
  ST::operator+(&local_9e0,&local_a00,(string *)&gtest_ar_30.message_);
  ST::string::operator=((string *)local_900,&local_9e0);
  ST::string::~string(&local_9e0);
  ST::string::~string((string *)&gtest_ar_30.message_);
  ST::string::~string(&local_a00);
  local_a34 = 0;
  local_a40 = ST::string::find((string *)local_900,utf8_test_data,case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_a30,"0","haystack.find(utf8_test_data, ST::case_sensitive)",
             &local_a34,&local_a40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a30);
  if (!bVar1) {
    testing::Message::Message(&local_a48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_a48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a30);
  local_a64 = 0;
  local_a70 = ST::string::find((string *)local_900,utf8_test_data,case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_a60,"0","haystack.find(utf8_test_data, ST::case_insensitive)",
             &local_a64,&local_a70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar1) {
    testing::Message::Message(&local_a78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
    testing::internal::AssertHelper::AssertHelper
              (&local_a80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a80,&local_a78);
    testing::internal::AssertHelper::~AssertHelper(&local_a80);
    testing::Message::~Message(&local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  ST::string::from_validated(&local_ae0,"xxxx",4);
  ST::string::from_utf32
            (&local_b00,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff,
             check_validity);
  ST::operator+(&local_ac0,&local_ae0,&local_b00);
  ST::string::from_validated((string *)&gtest_ar_32.message_,"xxxx",4);
  ST::operator+(&local_aa0,&local_ac0,(string *)&gtest_ar_32.message_);
  ST::string::operator=((string *)local_900,&local_aa0);
  ST::string::~string(&local_aa0);
  ST::string::~string((string *)&gtest_ar_32.message_);
  ST::string::~string(&local_ac0);
  ST::string::~string(&local_b00);
  ST::string::~string(&local_ae0);
  local_b34 = 4;
  local_b40 = ST::string::find((string *)local_900,utf8_test_data,case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_b30,"4","haystack.find(utf8_test_data, ST::case_sensitive)",
             &local_b34,&local_b40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
  if (!bVar1) {
    testing::Message::Message(&local_b48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_b48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
  local_b64 = 4;
  local_b70 = ST::string::find((string *)local_900,utf8_test_data,case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_b60,"4","haystack.find(utf8_test_data, ST::case_insensitive)",
             &local_b64,&local_b70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b60);
  if (!bVar1) {
    testing::Message::Message(&local_b78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_b78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b60);
  local_b94 = -1;
  ST::string::from_validated(&local_bc0,"ABCDabcd",8);
  local_ba0 = ST::string::find(&local_bc0,1,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_b90,"-1",
             "ST::string::from_validated(\"\" \"ABCDabcd\" \"\", sizeof(\"ABCDabcd\") - 1).find(1, \"ABCD\", ST::case_sensitive)"
             ,&local_b94,&local_ba0);
  ST::string::~string(&local_bc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_bc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
  local_be4 = 4;
  ST::string::from_validated(&local_c10,"abcdABCDABCDabcd",0x10);
  local_bf0 = ST::string::find(&local_c10,1,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_be0,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(1, \"ABCD\", ST::case_sensitive)"
             ,&local_be4,&local_bf0);
  ST::string::~string(&local_c10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_be0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_c18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
  local_c34 = 4;
  ST::string::from_validated(&local_c60,"abcdABCDABCDabcd",0x10);
  local_c40 = ST::string::find(&local_c60,4,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_c30,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(4, \"ABCD\", ST::case_sensitive)"
             ,&local_c34,&local_c40);
  ST::string::~string(&local_c60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c30);
  if (!bVar1) {
    testing::Message::Message(&local_c68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_c68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_c68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c30);
  local_c84 = 8;
  ST::string::from_validated(&local_cb0,"abcdABCDABCDabcd",0x10);
  local_c90 = ST::string::find(&local_cb0,5,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_c80,"8",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(5, \"ABCD\", ST::case_sensitive)"
             ,&local_c84,&local_c90);
  ST::string::~string(&local_cb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
  if (!bVar1) {
    testing::Message::Message(&local_cb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_cb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
  local_cd4 = -1;
  ST::string::from_validated(&local_d00,"abcdABCDabcd",0xc);
  local_ce0 = ST::string::find(&local_d00,5,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_cd0,"-1",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(5, \"ABCD\", ST::case_sensitive)"
             ,&local_cd4,&local_ce0);
  ST::string::~string(&local_d00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd0);
  if (!bVar1) {
    testing::Message::Message(&local_d08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_d08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_d08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
  local_d24 = -1;
  ST::string::from_validated(&local_d50,"abcdABCDabcd",0xc);
  local_d30 = ST::string::find(&local_d50,100,"ABCD",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_d20,"-1",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(100, \"ABCD\", ST::case_sensitive)"
             ,&local_d24,&local_d30);
  ST::string::~string(&local_d50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d20);
  if (!bVar1) {
    testing::Message::Message(&local_d58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6aa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_d58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_d58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d20);
  local_d74 = -1;
  ST::string::from_validated(&local_da0,"abcdxxxx",8);
  local_d80 = ST::string::find(&local_da0,1,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_d70,"-1",
             "ST::string::from_validated(\"\" \"abcdxxxx\" \"\", sizeof(\"abcdxxxx\") - 1).find(1, \"ABCD\", ST::case_insensitive)"
             ,&local_d74,&local_d80);
  ST::string::~string(&local_da0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d70);
  if (!bVar1) {
    testing::Message::Message(&local_da8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6ad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_da8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d70);
  local_dc4 = 4;
  ST::string::from_validated(&local_df0,"xxxxabcdabcdxxxx",0x10);
  local_dd0 = ST::string::find(&local_df0,1,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_dc0,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(1, \"ABCD\", ST::case_insensitive)"
             ,&local_dc4,&local_dd0);
  ST::string::~string(&local_df0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
  if (!bVar1) {
    testing::Message::Message(&local_df8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6ae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_df8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
  local_e14 = 4;
  ST::string::from_validated(&local_e40,"xxxxabcdabcdxxxx",0x10);
  local_e20 = ST::string::find(&local_e40,4,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_e10,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(4, \"ABCD\", ST::case_insensitive)"
             ,&local_e14,&local_e20);
  ST::string::~string(&local_e40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e10);
  if (!bVar1) {
    testing::Message::Message(&local_e48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6af,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_e48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_e48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e10);
  local_e64 = 8;
  ST::string::from_validated(&local_e90,"xxxxabcdabcdxxxx",0x10);
  local_e70 = ST::string::find(&local_e90,5,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_e60,"8",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(5, \"ABCD\", ST::case_insensitive)"
             ,&local_e64,&local_e70);
  ST::string::~string(&local_e90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e60);
  if (!bVar1) {
    testing::Message::Message(&local_e98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_e98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e60);
  local_eb4 = -1;
  ST::string::from_validated(&local_ee0,"xxxxabcdxxxx",0xc);
  local_ec0 = ST::string::find(&local_ee0,5,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_eb0,"-1",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(5, \"ABCD\", ST::case_insensitive)"
             ,&local_eb4,&local_ec0);
  ST::string::~string(&local_ee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_eb0);
  if (!bVar1) {
    testing::Message::Message(&local_ee8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_eb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_ee8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_eb0);
  local_f04 = -1;
  ST::string::from_validated(&local_f30,"xxxxabcdxxxx",0xc);
  local_f10 = ST::string::find(&local_f30,100,"ABCD",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_f00,"-1",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(100, \"ABCD\", ST::case_insensitive)"
             ,&local_f04,&local_f10);
  ST::string::~string(&local_f30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f00);
  if (!bVar1) {
    testing::Message::Message(&local_f38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_f38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_f38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f00);
  local_f54 = -1;
  ST::string::from_validated(&local_f80,"xxxx",4);
  local_f60 = ST::string::find(&local_f80,"",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_f50,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_sensitive)"
             ,&local_f54,&local_f60);
  ST::string::~string(&local_f80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f50);
  if (!bVar1) {
    testing::Message::Message(&local_f88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_f88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_f88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f50);
  local_fa4 = -1;
  ST::string::from_validated(&local_fd0,"xxxx",4);
  local_fb0 = ST::string::find(&local_fd0,"",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_fa0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_insensitive)"
             ,&local_fa4,&local_fb0);
  ST::string::~string(&local_fd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
  if (!bVar1) {
    testing::Message::Message(&local_fd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fa0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_fd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_fd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
  local_ff4 = -1;
  ST::string::from_validated(&local_1020,"xxxx",4);
  local_1000 = ST::string::find(&local_1020,4,"",case_sensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_ff0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(4, \"\", ST::case_sensitive)"
             ,&local_ff4,&local_1000);
  ST::string::~string(&local_1020);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff0);
  if (!bVar1) {
    testing::Message::Message(&local_1028);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ff0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_1028);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff0);
  local_1044 = -1;
  ST::string::from_validated(&local_1070,"xxxx",4);
  local_1050 = ST::string::find(&local_1070,4,"",case_insensitive);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_1040,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(4, \"\", ST::case_insensitive)"
             ,&local_1044,&local_1050);
  ST::string::~string(&local_1070);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1040);
  if (!bVar1) {
    testing::Message::Message(&local_1078);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1040);
    testing::internal::AssertHelper::AssertHelper
              (&local_1080,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1080,&local_1078);
    testing::internal::AssertHelper::~AssertHelper(&local_1080);
    testing::Message::~Message(&local_1078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1040);
  ST::string::~string((string *)local_900);
  return;
}

Assistant:

TEST(string, find)
{
    // Available string, case sensitive
    EXPECT_EQ(0, ST_LITERAL("ABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCDABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCD").find("ABCD", ST::case_sensitive));

    // Available string, case insensitive
    EXPECT_EQ(0, ST_LITERAL("ABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCD").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(0, ST_LITERAL("abcdxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcdABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcdxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcd").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(0, ST_LITERAL("ABCDxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDabcdxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCD").find("abcd", ST::case_insensitive));

    // Unavailable string
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABC").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABC").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABCxxxx").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABCxxxx").find("ABCD", ST::case_insensitive));

    // Empty string
    EXPECT_EQ(-1, ST::string().find("AAAA", ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find("AAAA", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find((const char *)nullptr, ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find((const char *)nullptr, ST::case_sensitive));

    // Unicode substring
    ST::string haystack;
    haystack = ST_LITERAL("xxxx") + ST::string::from_utf32(test_data);
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_insensitive));

    haystack = ST::string::from_utf32(test_data) + ST_LITERAL("xxxx");
    EXPECT_EQ(0, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(0, haystack.find(utf8_test_data, ST::case_insensitive));

    haystack = ST_LITERAL("xxxx") + ST::string::from_utf32(test_data) + ST_LITERAL("xxxx");
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_insensitive));

    // Starting position, case senstive
    EXPECT_EQ(-1, ST_LITERAL("ABCDabcd").find(1, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 4, ST_LITERAL("abcdABCDABCDabcd").find(1, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 4, ST_LITERAL("abcdABCDABCDabcd").find(4, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 8, ST_LITERAL("abcdABCDABCDabcd").find(5, "ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("abcdABCDabcd").find(5, "ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("abcdABCDabcd").find(100, "ABCD", ST::case_sensitive));

    // Starting position, case insenstive
    EXPECT_EQ(-1, ST_LITERAL("abcdxxxx").find(1, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 4, ST_LITERAL("xxxxabcdabcdxxxx").find(1, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 4, ST_LITERAL("xxxxabcdabcdxxxx").find(4, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 8, ST_LITERAL("xxxxabcdabcdxxxx").find(5, "ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxabcdxxxx").find(5, "ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxabcdxxxx").find(100, "ABCD", ST::case_insensitive));

    // Empty search string
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find(4, "", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find(4, "", ST::case_insensitive));
}